

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::MatteMaterial::readFrom(MatteMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kd);
  BinaryReader::read<float,void>(binary,&this->sigma);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_sigma);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
  return;
}

Assistant:

void MatteMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(map_kd);
    binary.read(kd);
    binary.read(sigma);
    binary.read(map_sigma);
    binary.read(map_bump);
  }